

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_cast.hpp
# Opt level: O2

void __thiscall libtorrent::bdecode_node::reserve(bdecode_node *this,int tokens)

{
  std::vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ::reserve((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
             *)this,(long)tokens);
  return;
}

Assistant:

T numeric_cast(In v)
	{
		T r = static_cast<T>(v);
		TORRENT_ASSERT(v == static_cast<In>(r));
		TORRENT_ASSERT(std::is_unsigned<In>::value || std::is_signed<T>::value
			|| std::int64_t(v) >= 0);
		TORRENT_ASSERT(std::is_signed<In>::value || std::is_unsigned<T>::value
			|| std::size_t(v) <= std::size_t((std::numeric_limits<T>::max)()));
		return r;
	}